

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ObjectType::Decode(ObjectType *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  ObjectType *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 4) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8Domain);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8EntityKind);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Category);
  KDataStream::operator>>(pKVar2,&this->m_ui8SubCategory);
  return;
}

Assistant:

void ObjectType::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < OBJECT_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8Domain
           >> m_ui8EntityKind
           >> m_ui8Category
           >> m_ui8SubCategory;
}